

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  undefined4 uVar27;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  size_t sVar32;
  int iVar33;
  bool bVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  float fVar39;
  float fVar42;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar43;
  float fVar48;
  float fVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  float fVar51;
  float fVar56;
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  uint uVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  uint uVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  uint uVar81;
  float fVar82;
  uint uVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  int local_a2c;
  ulong local_a28;
  float fStack_a20;
  float fStack_a1c;
  RTCIntersectArguments *local_a10;
  ulong local_a08;
  ulong local_a00;
  ulong local_9f8;
  ulong local_9f0;
  Scene *scene;
  Geometry *local_9e0;
  ulong local_9d8;
  ulong local_9d0;
  ulong local_9c8;
  NodeRef *local_9c0;
  RayQueryContext *local_9b8;
  ulong local_9b0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  uint local_8c8;
  uint uStack_8c4;
  uint uStack_8c0;
  uint uStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  float local_808 [4];
  float local_7f8 [4];
  float local_7e8 [4];
  NodeRef stack [244];
  
  auVar21 = mm_lookupmask_ps._240_16_;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar6 = ray->tfar, 0.0 <= fVar6)) {
    local_9c0 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar15 = (ray->org).field_0.m128[0];
    fVar16 = (ray->org).field_0.m128[1];
    fVar17 = (ray->org).field_0.m128[2];
    fVar59 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar71 = 0.0;
    if (0.0 <= fVar59) {
      fVar71 = fVar59;
    }
    fVar59 = (ray->dir).field_0.m128[0];
    fVar61 = (ray->dir).field_0.m128[1];
    fVar63 = (ray->dir).field_0.m128[2];
    fVar51 = (ray->dir).field_0.m128[3];
    uVar35 = -(uint)(1e-18 <= ABS(fVar59));
    uVar36 = -(uint)(1e-18 <= ABS(fVar61));
    uVar37 = -(uint)(1e-18 <= ABS(fVar63));
    uVar38 = -(uint)(1e-18 <= ABS(fVar51));
    auVar44._0_4_ = (uint)fVar59 & uVar35;
    auVar44._4_4_ = (uint)fVar61 & uVar36;
    auVar44._8_4_ = (uint)fVar63 & uVar37;
    auVar44._12_4_ = (uint)fVar51 & uVar38;
    auVar52._0_8_ = CONCAT44(~uVar36,~uVar35) & 0x219392ef219392ef;
    auVar52._8_4_ = ~uVar37 & 0x219392ef;
    auVar52._12_4_ = ~uVar38 & 0x219392ef;
    auVar52 = auVar52 | auVar44;
    auVar44 = rcpps(auVar44,auVar52);
    fVar59 = auVar44._0_4_;
    fVar61 = auVar44._4_4_;
    fVar63 = auVar44._8_4_;
    fVar59 = (1.0 - auVar52._0_4_ * fVar59) * fVar59 + fVar59;
    fVar61 = (1.0 - auVar52._4_4_ * fVar61) * fVar61 + fVar61;
    fVar63 = (1.0 - auVar52._8_4_ * fVar63) * fVar63 + fVar63;
    local_9c8 = (ulong)(fVar59 < 0.0) << 4;
    local_9d0 = (ulong)(fVar61 < 0.0) << 4 | 0x20;
    uVar29 = (ulong)(fVar63 < 0.0) << 4 | 0x40;
    uVar30 = local_9c8 ^ 0x10;
    uVar28 = local_9d0 ^ 0x10;
    uVar25 = uVar29 ^ 0x10;
    local_9b8 = context;
    local_a08 = uVar25;
    local_a00 = uVar28;
    local_9f8 = uVar30;
    local_9f0 = uVar29;
    do {
      if (local_9c0 == stack) {
        return;
      }
      sVar32 = local_9c0[-1].ptr;
      local_9c0 = local_9c0 + -1;
      do {
        if ((sVar32 & 8) == 0) {
          pfVar4 = (float *)(sVar32 + 0x20 + local_9c8);
          auVar40._0_4_ = (*pfVar4 - fVar15) * fVar59;
          auVar40._4_4_ = (pfVar4[1] - fVar15) * fVar59;
          auVar40._8_4_ = (pfVar4[2] - fVar15) * fVar59;
          auVar40._12_4_ = (pfVar4[3] - fVar15) * fVar59;
          pfVar4 = (float *)(sVar32 + 0x20 + local_9d0);
          auVar45._0_4_ = (*pfVar4 - fVar16) * fVar61;
          auVar45._4_4_ = (pfVar4[1] - fVar16) * fVar61;
          auVar45._8_4_ = (pfVar4[2] - fVar16) * fVar61;
          auVar45._12_4_ = (pfVar4[3] - fVar16) * fVar61;
          auVar44 = maxps(auVar40,auVar45);
          pfVar4 = (float *)(sVar32 + 0x20 + uVar29);
          auVar46._0_4_ = (*pfVar4 - fVar17) * fVar63;
          auVar46._4_4_ = (pfVar4[1] - fVar17) * fVar63;
          auVar46._8_4_ = (pfVar4[2] - fVar17) * fVar63;
          auVar46._12_4_ = (pfVar4[3] - fVar17) * fVar63;
          auVar12._4_4_ = fVar71;
          auVar12._0_4_ = fVar71;
          auVar12._8_4_ = fVar71;
          auVar12._12_4_ = fVar71;
          auVar52 = maxps(auVar46,auVar12);
          auVar44 = maxps(auVar44,auVar52);
          pfVar4 = (float *)(sVar32 + 0x20 + uVar30);
          auVar47._0_4_ = (*pfVar4 - fVar15) * fVar59;
          auVar47._4_4_ = (pfVar4[1] - fVar15) * fVar59;
          auVar47._8_4_ = (pfVar4[2] - fVar15) * fVar59;
          auVar47._12_4_ = (pfVar4[3] - fVar15) * fVar59;
          pfVar4 = (float *)(sVar32 + 0x20 + uVar28);
          auVar53._0_4_ = (*pfVar4 - fVar16) * fVar61;
          auVar53._4_4_ = (pfVar4[1] - fVar16) * fVar61;
          auVar53._8_4_ = (pfVar4[2] - fVar16) * fVar61;
          auVar53._12_4_ = (pfVar4[3] - fVar16) * fVar61;
          auVar52 = minps(auVar47,auVar53);
          pfVar4 = (float *)(sVar32 + 0x20 + uVar25);
          auVar54._0_4_ = (*pfVar4 - fVar17) * fVar63;
          auVar54._4_4_ = (pfVar4[1] - fVar17) * fVar63;
          auVar54._8_4_ = (pfVar4[2] - fVar17) * fVar63;
          auVar54._12_4_ = (pfVar4[3] - fVar17) * fVar63;
          auVar55._4_4_ = fVar6;
          auVar55._0_4_ = fVar6;
          auVar55._8_4_ = fVar6;
          auVar55._12_4_ = fVar6;
          auVar55 = minps(auVar54,auVar55);
          auVar52 = minps(auVar52,auVar55);
          auVar41._4_4_ = -(uint)(auVar44._4_4_ <= auVar52._4_4_);
          auVar41._0_4_ = -(uint)(auVar44._0_4_ <= auVar52._0_4_);
          auVar41._8_4_ = -(uint)(auVar44._8_4_ <= auVar52._8_4_);
          auVar41._12_4_ = -(uint)(auVar44._12_4_ <= auVar52._12_4_);
          uVar27 = movmskps((int)unaff_RBX,auVar41);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar27);
        }
        if ((sVar32 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar33 = 4;
          }
          else {
            uVar31 = sVar32 & 0xfffffffffffffff0;
            lVar24 = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            iVar33 = 0;
            sVar32 = *(size_t *)(uVar31 + lVar24 * 8);
            uVar26 = unaff_RBX - 1 & unaff_RBX;
            if (uVar26 != 0) {
              local_9c0->ptr = sVar32;
              lVar24 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              uVar23 = uVar26 - 1;
              while( true ) {
                local_9c0 = local_9c0 + 1;
                sVar32 = *(size_t *)(uVar31 + lVar24 * 8);
                uVar23 = uVar23 & uVar26;
                if (uVar23 == 0) break;
                local_9c0->ptr = sVar32;
                lVar24 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                uVar26 = uVar23 - 1;
              }
            }
          }
        }
        else {
          iVar33 = 6;
        }
      } while (iVar33 == 0);
      if (iVar33 == 6) {
        iVar33 = 0;
        local_9b0 = (ulong)((uint)sVar32 & 0xf) - 8;
        bVar34 = local_9b0 != 0;
        if (bVar34) {
          uVar26 = sVar32 & 0xfffffffffffffff0;
          scene = local_9b8->scene;
          uVar31 = 0;
          do {
            lVar24 = uVar31 * 0x50;
            ppfVar7 = (scene->vertices).items;
            pfVar8 = ppfVar7[*(uint *)(uVar26 + 0x30 + lVar24)];
            pfVar4 = pfVar8 + *(uint *)(uVar26 + lVar24);
            fVar51 = *pfVar4;
            fVar43 = pfVar4[1];
            fVar39 = pfVar4[2];
            pfVar4 = pfVar8 + *(uint *)(uVar26 + 0x10 + lVar24);
            pfVar8 = pfVar8 + *(uint *)(uVar26 + 0x20 + lVar24);
            pfVar9 = ppfVar7[*(uint *)(uVar26 + 0x34 + lVar24)];
            pfVar1 = pfVar9 + *(uint *)(uVar26 + 4 + lVar24);
            fVar56 = *pfVar1;
            fVar48 = pfVar1[1];
            fVar42 = pfVar1[2];
            pfVar1 = pfVar9 + *(uint *)(uVar26 + 0x14 + lVar24);
            pfVar9 = pfVar9 + *(uint *)(uVar26 + 0x24 + lVar24);
            pfVar10 = ppfVar7[*(uint *)(uVar26 + 0x38 + lVar24)];
            pfVar2 = pfVar10 + *(uint *)(uVar26 + 8 + lVar24);
            fVar57 = *pfVar2;
            fVar49 = pfVar2[1];
            fStack_a20 = pfVar2[2];
            pfVar2 = pfVar10 + *(uint *)(uVar26 + 0x18 + lVar24);
            pfVar10 = pfVar10 + *(uint *)(uVar26 + 0x28 + lVar24);
            pfVar11 = ppfVar7[*(uint *)(uVar26 + 0x3c + lVar24)];
            pfVar3 = pfVar11 + *(uint *)(uVar26 + 0xc + lVar24);
            fVar58 = *pfVar3;
            fVar50 = pfVar3[1];
            fStack_a1c = pfVar3[2];
            pfVar3 = pfVar11 + *(uint *)(uVar26 + 0x1c + lVar24);
            uVar35 = *(uint *)(uVar26 + 0x2c + lVar24);
            pfVar11 = pfVar11 + uVar35;
            puVar5 = (undefined8 *)(uVar26 + 0x30 + lVar24);
            local_8a8 = *puVar5;
            uStack_8a0 = puVar5[1];
            puVar5 = (undefined8 *)(uVar26 + 0x40 + lVar24);
            local_8b8 = *puVar5;
            uStack_8b0 = puVar5[1];
            fVar76 = fVar51 - *pfVar4;
            fVar78 = fVar56 - *pfVar1;
            fVar80 = fVar57 - *pfVar2;
            fVar82 = fVar58 - *pfVar3;
            fVar88 = fVar43 - pfVar4[1];
            fVar89 = fVar48 - pfVar1[1];
            fVar90 = fVar49 - pfVar2[1];
            fVar91 = fVar50 - pfVar3[1];
            fVar92 = fVar39 - pfVar4[2];
            fVar94 = fVar42 - pfVar1[2];
            fVar96 = fStack_a20 - pfVar2[2];
            fVar98 = fStack_a1c - pfVar3[2];
            fVar60 = *pfVar8 - fVar51;
            fVar62 = *pfVar9 - fVar56;
            fVar64 = *pfVar10 - fVar57;
            fVar65 = *pfVar11 - fVar58;
            fVar72 = pfVar8[1] - fVar43;
            fVar73 = pfVar9[1] - fVar48;
            fVar74 = pfVar10[1] - fVar49;
            fVar75 = pfVar11[1] - fVar50;
            fVar66 = pfVar8[2] - fVar39;
            fVar67 = pfVar9[2] - fVar42;
            fVar68 = pfVar10[2] - fStack_a20;
            fVar69 = pfVar11[2] - fStack_a1c;
            local_808[0] = fVar92 * fVar72 - fVar88 * fVar66;
            local_808[1] = fVar94 * fVar73 - fVar89 * fVar67;
            local_808[2] = fVar96 * fVar74 - fVar90 * fVar68;
            local_808[3] = fVar98 * fVar75 - fVar91 * fVar69;
            fVar84 = (ray->org).field_0.m128[0];
            fVar85 = (ray->org).field_0.m128[1];
            fVar86 = (ray->org).field_0.m128[2];
            fVar87 = (ray->dir).field_0.m128[0];
            fVar18 = (ray->dir).field_0.m128[1];
            fVar19 = (ray->dir).field_0.m128[2];
            fVar51 = fVar51 - fVar84;
            fVar56 = fVar56 - fVar84;
            fVar57 = fVar57 - fVar84;
            fVar58 = fVar58 - fVar84;
            fVar43 = fVar43 - fVar85;
            fVar48 = fVar48 - fVar85;
            fVar49 = fVar49 - fVar85;
            fVar50 = fVar50 - fVar85;
            fVar104 = fVar51 * fVar18 - fVar43 * fVar87;
            fVar105 = fVar56 * fVar18 - fVar48 * fVar87;
            fVar106 = fVar57 * fVar18 - fVar49 * fVar87;
            fVar107 = fVar58 * fVar18 - fVar50 * fVar87;
            local_7f8[0] = fVar76 * fVar66 - fVar92 * fVar60;
            local_7f8[1] = fVar78 * fVar67 - fVar94 * fVar62;
            local_7f8[2] = fVar80 * fVar68 - fVar96 * fVar64;
            local_7f8[3] = fVar82 * fVar69 - fVar98 * fVar65;
            fVar39 = fVar39 - fVar86;
            fVar42 = fVar42 - fVar86;
            fStack_a20 = fStack_a20 - fVar86;
            fStack_a1c = fStack_a1c - fVar86;
            fVar100 = fVar39 * fVar87 - fVar51 * fVar19;
            fVar101 = fVar42 * fVar87 - fVar56 * fVar19;
            fVar102 = fStack_a20 * fVar87 - fVar57 * fVar19;
            fVar103 = fStack_a1c * fVar87 - fVar58 * fVar19;
            local_7e8[0] = fVar88 * fVar60 - fVar76 * fVar72;
            local_7e8[1] = fVar89 * fVar62 - fVar78 * fVar73;
            local_7e8[2] = fVar90 * fVar64 - fVar80 * fVar74;
            local_7e8[3] = fVar91 * fVar65 - fVar82 * fVar75;
            fVar93 = fVar43 * fVar19 - fVar39 * fVar18;
            fVar95 = fVar48 * fVar19 - fVar42 * fVar18;
            fVar97 = fVar49 * fVar19 - fStack_a20 * fVar18;
            fVar99 = fVar50 * fVar19 - fStack_a1c * fVar18;
            fVar84 = fVar87 * local_808[0] + fVar18 * local_7f8[0] + fVar19 * local_7e8[0];
            fVar85 = fVar87 * local_808[1] + fVar18 * local_7f8[1] + fVar19 * local_7e8[1];
            fVar86 = fVar87 * local_808[2] + fVar18 * local_7f8[2] + fVar19 * local_7e8[2];
            fVar87 = fVar87 * local_808[3] + fVar18 * local_7f8[3] + fVar19 * local_7e8[3];
            uVar36 = (uint)fVar84 & 0x80000000;
            uVar37 = (uint)fVar85 & 0x80000000;
            uVar38 = (uint)fVar86 & 0x80000000;
            uVar70 = (uint)fVar87 & 0x80000000;
            local_898 = (float)((uint)(fVar60 * fVar93 + fVar72 * fVar100 + fVar66 * fVar104) ^
                               uVar36);
            fStack_894 = (float)((uint)(fVar62 * fVar95 + fVar73 * fVar101 + fVar67 * fVar105) ^
                                uVar37);
            fStack_890 = (float)((uint)(fVar64 * fVar97 + fVar74 * fVar102 + fVar68 * fVar106) ^
                                uVar38);
            fStack_88c = (float)((uint)(fVar65 * fVar99 + fVar75 * fVar103 + fVar69 * fVar107) ^
                                uVar70);
            local_888 = (float)((uint)(fVar93 * fVar76 + fVar100 * fVar88 + fVar104 * fVar92) ^
                               uVar36);
            fStack_884 = (float)((uint)(fVar95 * fVar78 + fVar101 * fVar89 + fVar105 * fVar94) ^
                                uVar37);
            fStack_880 = (float)((uint)(fVar97 * fVar80 + fVar102 * fVar90 + fVar106 * fVar96) ^
                                uVar38);
            fStack_87c = (float)((uint)(fVar99 * fVar82 + fVar103 * fVar91 + fVar107 * fVar98) ^
                                uVar70);
            local_868 = ABS(fVar84);
            fStack_864 = ABS(fVar85);
            fStack_860 = ABS(fVar86);
            fStack_85c = ABS(fVar87);
            local_8c8 = auVar21._0_4_;
            uStack_8c4 = auVar21._4_4_;
            uStack_8c0 = auVar21._8_4_;
            uStack_8bc = auVar21._12_4_;
            uVar77 = -(uint)(local_898 + local_888 <= local_868) &
                     -(uint)((0.0 <= local_888 && 0.0 <= local_898) && fVar84 != 0.0) & local_8c8;
            uVar79 = -(uint)(fStack_894 + fStack_884 <= fStack_864) &
                     -(uint)((0.0 <= fStack_884 && 0.0 <= fStack_894) && fVar85 != 0.0) & uStack_8c4
            ;
            uVar81 = -(uint)(fStack_890 + fStack_880 <= fStack_860) &
                     -(uint)((0.0 <= fStack_880 && 0.0 <= fStack_890) && fVar86 != 0.0) & uStack_8c0
            ;
            uVar83 = -(uint)(fStack_88c + fStack_87c <= fStack_85c) &
                     -(uint)((0.0 <= fStack_87c && 0.0 <= fStack_88c) && fVar87 != 0.0) & uStack_8bc
            ;
            auVar14._4_4_ = uVar79;
            auVar14._0_4_ = uVar77;
            auVar14._8_4_ = uVar81;
            auVar14._12_4_ = uVar83;
            iVar22 = movmskps((int)lVar24,auVar14);
            if (iVar22 != 0) {
              local_878 = (float)(uVar36 ^ (uint)(fVar51 * local_808[0] +
                                                 fVar43 * local_7f8[0] + fVar39 * local_7e8[0]));
              fStack_874 = (float)(uVar37 ^ (uint)(fVar56 * local_808[1] +
                                                  fVar48 * local_7f8[1] + fVar42 * local_7e8[1]));
              fStack_870 = (float)(uVar38 ^ (uint)(fVar57 * local_808[2] +
                                                  fVar49 * local_7f8[2] + fStack_a20 * local_7e8[2])
                                  );
              fStack_86c = (float)(uVar70 ^ (uint)(fVar58 * local_808[3] +
                                                  fVar50 * local_7f8[3] + fStack_a1c * local_7e8[3])
                                  );
              fVar51 = (ray->org).field_0.m128[3];
              fVar43 = ray->tfar;
              local_848._0_4_ =
                   -(uint)(local_878 <= fVar43 * local_868 && fVar51 * local_868 < local_878) &
                   uVar77;
              local_848._4_4_ =
                   -(uint)(fStack_874 <= fVar43 * fStack_864 && fVar51 * fStack_864 < fStack_874) &
                   uVar79;
              local_848._8_4_ =
                   -(uint)(fStack_870 <= fVar43 * fStack_860 && fVar51 * fStack_860 < fStack_870) &
                   uVar81;
              local_848._12_4_ =
                   -(uint)(fStack_86c <= fVar43 * fStack_85c && fVar51 * fStack_85c < fStack_86c) &
                   uVar83;
              uVar35 = movmskps(uVar35,local_848);
              local_a28 = (ulong)uVar35;
              if (uVar35 != 0) {
                auVar13._4_4_ = fStack_864;
                auVar13._0_4_ = local_868;
                auVar13._8_4_ = fStack_860;
                auVar13._12_4_ = fStack_85c;
                auVar44 = rcpps(local_848,auVar13);
                fVar51 = auVar44._0_4_;
                fVar43 = auVar44._4_4_;
                fVar39 = auVar44._8_4_;
                fVar56 = auVar44._12_4_;
                fVar51 = (1.0 - local_868 * fVar51) * fVar51 + fVar51;
                fVar43 = (1.0 - fStack_864 * fVar43) * fVar43 + fVar43;
                fVar39 = (1.0 - fStack_860 * fVar39) * fVar39 + fVar39;
                fVar56 = (1.0 - fStack_85c * fVar56) * fVar56 + fVar56;
                local_818[0] = local_878 * fVar51;
                local_818[1] = fStack_874 * fVar43;
                local_818[2] = fStack_870 * fVar39;
                local_818[3] = fStack_86c * fVar56;
                local_838._0_4_ = local_898 * fVar51;
                local_838._4_4_ = fStack_894 * fVar43;
                local_838._8_4_ = fStack_890 * fVar39;
                local_838._12_4_ = fStack_88c * fVar56;
                local_828._0_4_ = fVar51 * local_888;
                local_828._4_4_ = fVar43 * fStack_884;
                local_828._8_4_ = fVar39 * fStack_880;
                local_828._12_4_ = fVar56 * fStack_87c;
                do {
                  local_9d8 = 0;
                  if (local_a28 != 0) {
                    for (; (local_a28 >> local_9d8 & 1) == 0; local_9d8 = local_9d8 + 1) {
                    }
                  }
                  h.geomID = *(uint *)((long)&local_8a8 + local_9d8 * 4);
                  local_9e0 = (scene->geometries).items[h.geomID].ptr;
                  if ((local_9e0->mask & ray->mask) == 0) {
                    local_a28 = local_a28 ^ 1L << (local_9d8 & 0x3f);
                    bVar20 = true;
                  }
                  else {
                    local_a10 = local_9b8->args;
                    if ((local_a10->filter == (RTCFilterFunctionN)0x0) &&
                       (local_9e0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar20 = false;
                    }
                    else {
                      h.u = *(float *)(local_838 + local_9d8 * 4);
                      h.v = local_818[local_9d8 - 4];
                      args.context = local_9b8->user;
                      h.primID = *(uint *)((long)&local_8b8 + local_9d8 * 4);
                      h.Ng.field_0.field_0.x = local_808[local_9d8];
                      h.Ng.field_0.field_0.y = local_7f8[local_9d8];
                      h.Ng.field_0.field_0.z = local_7e8[local_9d8];
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      fVar51 = ray->tfar;
                      ray->tfar = local_818[local_9d8];
                      local_a2c = -1;
                      args.valid = &local_a2c;
                      args.geometryUserPtr = local_9e0->userPtr;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      args.ray = (RTCRayN *)ray;
                      if ((local_9e0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_9e0->occlusionFilterN)(&args), *args.valid != 0)) {
                        if (local_a10->filter != (RTCFilterFunctionN)0x0) {
                          if (((local_a10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((local_9e0->field_8).field_0x2 & 0x40) != 0)) {
                            (*local_a10->filter)(&args);
                          }
                          if (*args.valid == 0) goto LAB_0019719a;
                        }
                        bVar20 = false;
                      }
                      else {
LAB_0019719a:
                        ray->tfar = fVar51;
                        local_a28 = local_a28 ^ 1L << (local_9d8 & 0x3f);
                        bVar20 = true;
                      }
                    }
                  }
                  if (!bVar20) {
                    uVar25 = local_a08;
                    uVar28 = local_a00;
                    uVar29 = local_9f0;
                    uVar30 = local_9f8;
                    if (bVar34) {
                      ray->tfar = -INFINITY;
                      iVar33 = 3;
                    }
                    goto LAB_0019723b;
                  }
                } while (local_a28 != 0);
              }
            }
            uVar31 = uVar31 + 1;
            bVar34 = uVar31 < local_9b0;
            uVar25 = local_a08;
            uVar28 = local_a00;
            uVar29 = local_9f0;
            uVar30 = local_9f8;
          } while (uVar31 != local_9b0);
        }
      }
LAB_0019723b:
    } while (iVar33 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }